

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaFxch.c
# Opt level: O1

int Fxch_TabSingleDivisors(Fxch_Man_t *p,int iCube,int fAdd)

{
  long lVar1;
  int Lit1;
  Vec_Int_t *pVVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  long local_40;
  
  if ((-1 < iCube) && (iCube < (p->vCubes).nSize)) {
    pVVar2 = (p->vCubes).pArray;
    iVar3 = 0;
    if (1 < pVVar2[(uint)iCube].nSize) {
      iVar3 = pVVar2[(uint)iCube].nSize;
      if (0 < iVar3) {
        local_40 = 1;
        lVar4 = 0;
        do {
          lVar1 = lVar4 + 1;
          if (lVar1 < pVVar2[(uint)iCube].nSize) {
            iVar3 = pVVar2[(uint)iCube].pArray[lVar4];
            lVar4 = local_40;
            do {
              Lit1 = pVVar2[(uint)iCube].pArray[lVar4];
              if (Lit1 <= iVar3) {
                __assert_fail("Lit < Lit2",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/pla/plaFxch.c"
                              ,0x22f,"int Fxch_TabSingleDivisors(Fxch_Man_t *, int, int)");
              }
              if (fAdd == 0) {
                Fxch_DivisorRemove(p,iVar3,Lit1,1);
                iVar5 = -1;
              }
              else {
                iVar5 = 1;
                Fxch_DivisorAdd(p,iVar3,Lit1,1);
              }
              p->nPairsS = p->nPairsS + iVar5;
              lVar4 = lVar4 + 1;
            } while ((int)lVar4 < pVVar2[(uint)iCube].nSize);
          }
          iVar3 = pVVar2[(uint)iCube].nSize;
          local_40 = local_40 + 1;
          lVar4 = lVar1;
        } while (lVar1 < iVar3);
      }
      iVar3 = ((iVar3 + -1) * iVar3) / 2;
    }
    return iVar3;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWec.h"
                ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
}

Assistant:

int Fxch_TabSingleDivisors( Fxch_Man_t * p, int iCube, int fAdd )
{
    Vec_Int_t * vCube = Vec_WecEntry( &p->vCubes, iCube );
    int i, k, Lit, Lit2;
    if ( Vec_IntSize(vCube) < 2 )
        return 0;
    Vec_IntForEachEntry( vCube, Lit, i )
    Vec_IntForEachEntryStart( vCube, Lit2, k, i+1 )
    {
        assert( Lit < Lit2 );
        if ( fAdd )
            Fxch_DivisorAdd( p, Lit, Lit2, 1 ), p->nPairsS++;
        else
            Fxch_DivisorRemove( p, Lit, Lit2, 1 ), p->nPairsS--;
    }
    return Vec_IntSize(vCube) * (Vec_IntSize(vCube) - 1) / 2;
}